

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_st_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o)

{
  TCGArg o_local;
  TCGv_ptr b_local;
  TCGv_vec r_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  vec_gen_ldst(tcg_ctx,INDEX_op_st_vec,r,b,o);
  return;
}

Assistant:

void tcg_gen_st_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o)
{
    vec_gen_ldst(tcg_ctx, INDEX_op_st_vec, r, b, o);
}